

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

QList<QListWidgetItem_*> * __thiscall QListWidget::selectedItems(QListWidget *this)

{
  QListWidgetPrivate *this_00;
  qsizetype qVar1;
  QListModel *t;
  const_reference this_01;
  QListModel *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000008;
  int i;
  int numIndexes;
  QListWidgetPrivate *d;
  QList<QListWidgetItem_*> *items;
  QModelIndexList indexes;
  QListModel *this_02;
  int local_44;
  QList<QModelIndex> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = in_RDI;
  this_00 = d_func((QListWidget *)0x89e8bc);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::selectionModel((QAbstractItemView *)this_02);
  QItemSelectionModel::selectedIndexes();
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->items).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QListWidgetItem_*>::QList((QList<QListWidgetItem_*> *)0x89e92b);
  qVar1 = QList<QModelIndex>::size(&local_20);
  QList<QListWidgetItem_*>::reserve((QList<QListWidgetItem_*> *)this_00,in_stack_00000008);
  for (local_44 = 0; local_44 < (int)qVar1; local_44 = local_44 + 1) {
    t = QListWidgetPrivate::listModel((QListWidgetPrivate *)0x89e964);
    this_01 = QList<QModelIndex>::at((QList<QModelIndex> *)this_02,(qsizetype)t);
    QModelIndex::row(this_01);
    QListModel::at(this_02,(int)((ulong)t >> 0x20));
    QList<QListWidgetItem_*>::append((QList<QListWidgetItem_*> *)0x89e997,(parameter_type)t);
  }
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x89e9c4);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<QListWidgetItem_*> *)this_02;
}

Assistant:

QList<QListWidgetItem*> QListWidget::selectedItems() const
{
    Q_D(const QListWidget);
    QModelIndexList indexes = selectionModel()->selectedIndexes();
    QList<QListWidgetItem*> items;
    const int numIndexes = indexes.size();
    items.reserve(numIndexes);
    for (int i = 0; i < numIndexes; ++i)
        items.append(d->listModel()->at(indexes.at(i).row()));
    return items;
}